

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyImage::FunctionalTest::calculateDimmensions
          (FunctionalTest *this,GLenum target,GLuint level,GLuint width,GLuint height,
          GLuint *out_widths,GLuint *out_heights,GLuint *out_depths)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  GLuint i;
  long lVar5;
  bool bVar6;
  uint auStack_20 [5];
  GLuint factors [3];
  
  uVar1 = 1;
  if ((int)target < 0x8c1a) {
    if ((target != 0x806f) && (target != 0x8c18)) goto LAB_0087b4aa;
  }
  else if ((target != 0x8c1a) && ((target != 0x9102 && (target != 0x9009)))) goto LAB_0087b4aa;
  uVar1 = 0xc;
LAB_0087b4aa:
  if (-1 < (int)level) {
    uVar4 = (ulong)level;
    uVar3 = 100;
    do {
      auStack_20[uVar4 + 1] = uVar3;
      uVar3 = uVar3 * 2;
      bVar6 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar6);
  }
  if (level + 1 < 3) {
    uVar4 = (ulong)(level + 1);
    uVar3 = 0x32;
    do {
      uVar4 = uVar4 + 1;
      auStack_20[uVar4] = uVar3;
      uVar3 = uVar3 >> 1;
    } while ((int)uVar4 != 3);
  }
  lVar5 = 0;
  do {
    uVar3 = auStack_20[lVar5 + 1];
    out_widths[lVar5] = (uVar3 * width) / 100;
    out_heights[lVar5] = (uVar3 * height) / 100;
    uVar2 = uVar1;
    if (target == 0x806f) {
      uVar2 = (uVar3 * 0xc) / 100;
    }
    out_depths[lVar5] = uVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  return;
}

Assistant:

void FunctionalTest::calculateDimmensions(GLenum target, GLuint level, GLuint width, GLuint height, GLuint* out_widths,
										  GLuint* out_heights, GLuint* out_depths) const
{
	GLuint		 divide = 100;
	GLuint		 factors[FUNCTIONAL_TEST_N_LEVELS];
	GLuint		 factor			= divide;
	const bool   is_multi_layer = Utils::isTargetMultilayer(target);
	const GLuint n_layers		= (true == is_multi_layer) ? FUNCTIONAL_TEST_N_LAYERS : 1;

	for (GLint i = (GLint)level; i >= 0; --i)
	{
		factors[i] = factor;
		factor *= 2;
	}

	factor = divide / 2;
	for (GLuint i = level + 1; i < FUNCTIONAL_TEST_N_LEVELS; ++i)
	{
		factors[i] = factor;
		factor /= 2;
	}

	for (GLuint i = 0; i < FUNCTIONAL_TEST_N_LEVELS; ++i)
	{
		out_widths[i]  = width * factors[i] / divide;
		out_heights[i] = height * factors[i] / divide;

		if (GL_TEXTURE_3D == target)
		{
			out_depths[i] = FUNCTIONAL_TEST_N_LAYERS * factors[i] / divide;
		}
		else
		{
			out_depths[i] = n_layers;
		}
	}
}